

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

UnlocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
          (UnlocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> *this,
          MacroProps *macros)

{
  PluralRules *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  UNumberSignDisplay UVar5;
  long lVar6;
  Precision *pPVar7;
  Precision *pPVar8;
  byte bVar9;
  
  bVar9 = 0;
  impl::MacroProps::MacroProps((MacroProps *)__return_storage_ptr__,&this->fMacros);
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.notation.fUnion.scientific.fExponentSignDisplay =
       (macros->notation).fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.notation =
       *(undefined8 *)&macros->notation;
  MeasureUnit::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
              unit,&macros->unit);
  MeasureUnit::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
              perUnit,&macros->perUnit);
  pPVar7 = &macros->precision;
  pPVar8 = &(__return_storage_ptr__->
            super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
            precision;
  for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar4 = *(undefined4 *)&pPVar7->field_0x4;
    pPVar8->fType = pPVar7->fType;
    *(undefined4 *)&pPVar8->field_0x4 = uVar4;
    pPVar7 = (Precision *)((long)pPVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.integerWidth.fHasError = (macros->integerWidth).fHasError;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
           integerWidth.fUnion + 4) = *(undefined4 *)((long)&(macros->integerWidth).fUnion + 4);
  impl::SymbolsWrapper::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
              symbols,&macros->symbols);
  UVar5 = macros->sign;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.unitWidth = macros->unitWidth;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.sign = UVar5;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.decimal = macros->decimal;
  Scale::operator=(&(__return_storage_ptr__->
                    super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                    fMacros.scale,&macros->scale);
  pPVar1 = macros->rules;
  uVar2 = *(undefined8 *)((long)&macros->rules + 4);
  uVar3 = *(undefined8 *)((long)&macros->currencySymbols + 4);
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.affixProvider = macros->affixProvider;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.rules = pPVar1;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.rules
   + 4) = uVar2;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
           currencySymbols + 4) = uVar3;
  Locale::operator=(&(__return_storage_ptr__->
                     super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                     fMacros.locale,&macros->locale);
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::macros(impl::MacroProps&& macros) const& {
    Derived copy(*this);
    copy.fMacros = std::move(macros);
    return copy;
}